

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.cpp
# Opt level: O0

void __thiscall MyEntity::MyEntity(MyEntity *this,string *name)

{
  bind_t<double_&,_boost::_mfi::mf2<double_&,_MyEntity,_double_&,_const_int_&>,_boost::_bi::list3<boost::_bi::value<MyEntity_*>,_boost::arg<1>,_boost::arg<2>_>_>
  f;
  SignalArray<int> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  SignalArray_const<int> local_e0;
  code *local_b8;
  undefined8 local_b0;
  F local_a0;
  undefined8 uStack_98;
  storage2<boost::_bi::value<MyEntity_*>,_boost::arg<1>_> local_90;
  function2<double_&,_double_&,_int> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *name_local;
  MyEntity *this_local;
  
  local_18 = name;
  name_local = (string *)this;
  dynamicgraph::Entity::Entity(&this->super_Entity,(string *)name);
  *(undefined ***)this = &PTR__MyEntity_0015b8a8;
  std::operator+(&local_58,"MyEntity(",local_18);
  std::operator+(&local_38,&local_58,")::input(double)::in_double");
  dynamicgraph::SignalPtr<double,_int>::SignalPtr
            (&this->m_sigdSIN,(Signal<double,_int> *)0x0,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  local_b8 = update;
  local_b0 = 0;
  boost::bind<double&,MyEntity,double&,int_const&,MyEntity*,boost::arg<1>,boost::arg<2>>
            (&local_a0,(boost *)update,0);
  f.f_._8_8_ = uStack_98;
  f.f_.f_ = local_a0;
  f.l_.super_storage3<boost::_bi::value<MyEntity_*>,_boost::arg<1>,_boost::arg<2>_>.
  super_storage2<boost::_bi::value<MyEntity_*>,_boost::arg<1>_>.
  super_storage1<boost::_bi::value<MyEntity_*>_>.a1_.t_ =
       (storage3<boost::_bi::value<MyEntity_*>,_boost::arg<1>,_boost::arg<2>_>)
       (storage3<boost::_bi::value<MyEntity_*>,_boost::arg<1>,_boost::arg<2>_>)
       local_90.super_storage1<boost::_bi::value<MyEntity_*>_>.a1_.t_;
  boost::function2<double&,double&,int>::
  function2<boost::_bi::bind_t<double&,boost::_mfi::mf2<double&,MyEntity,double&,int_const&>,boost::_bi::list3<boost::_bi::value<MyEntity*>,boost::arg<1>,boost::arg<2>>>>
            ((function2<double&,double&,int> *)&local_88,f,0);
  dynamicgraph::SignalArray_const<int>::SignalArray_const
            (&local_e0,
             (SignalBase<int> *)
             ((this->m_sigdSIN)._vptr_SignalPtr[-3] + (long)&(this->m_sigdSIN)._vptr_SignalPtr));
  std::operator+(&local_120,"MyEntity(",local_18);
  std::operator+(&local_100,&local_120,")::input(double)::out_double");
  dynamicgraph::SignalTimeDependent<double,_int>::SignalTimeDependent
            (&this->m_sigdTimeDepSOUT,&local_88,&local_e0,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  dynamicgraph::SignalArray_const<int>::~SignalArray_const(&local_e0);
  boost::function2<double_&,_double_&,_int>::~function2(&local_88);
  dynamicgraph::operator<<
            (&local_160,
             (SignalBase<int> *)
             ((this->m_sigdSIN)._vptr_SignalPtr[-3] + (long)&(this->m_sigdSIN)._vptr_SignalPtr),
             (SignalBase<int> *)
             ((this->m_sigdTimeDepSOUT).super_TimeDependency<int>._vptr_TimeDependency[-3] +
             (long)&(this->m_sigdTimeDepSOUT).super_TimeDependency<int>._vptr_TimeDependency));
  dynamicgraph::Entity::signalRegistration((SignalArray *)this);
  dynamicgraph::SignalArray<int>::~SignalArray(&local_160);
  return;
}

Assistant:

explicit MyEntity(const std::string &name)
      : Entity(name),
        m_sigdSIN(NULL, "MyEntity(" + name + ")::input(double)::in_double"),
        m_sigdTimeDepSOUT(boost::bind(&MyEntity::update, this, _1, _2),
                          m_sigdSIN,
                          "MyEntity(" + name + ")::input(double)::out_double") {
    signalRegistration(m_sigdSIN << m_sigdTimeDepSOUT);
  }